

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_initialize_with_callbacks(ENetVersion version,ENetCallbacks *inits)

{
  _func_void_void_ptr *p_Var1;
  _func_void_ptr_size_t *p_Var2;
  _func_void_void_ptr *p_Var3;
  int iVar4;
  
  iVar4 = -1;
  if (0x102ff < version) {
    p_Var1 = inits->free;
    if (inits->malloc == (_func_void_ptr_size_t *)0x0) {
      p_Var2 = (_func_void_ptr_size_t *)callbacks_0;
      p_Var3 = (_func_void_void_ptr *)callbacks_1;
      if (p_Var1 != (_func_void_void_ptr *)0x0) {
        return -1;
      }
    }
    else {
      p_Var2 = inits->malloc;
      p_Var3 = p_Var1;
      if (p_Var1 == (_func_void_void_ptr *)0x0) {
        return -1;
      }
    }
    callbacks_1 = p_Var3;
    callbacks_0 = p_Var2;
    iVar4 = 0;
    if (inits->noMemory != (_func_void *)0x0) {
      callbacks_2 = inits->noMemory;
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

int enet_initialize_with_callbacks(ENetVersion version, const ENetCallbacks* inits) {
	if (version < ENET_VERSION_CREATE(1, 3, 0)) {
		ENET_LOG_ERROR("ENet version is too old");
		return -1;
	}

	if (inits->malloc != NULL || inits->free != NULL) {
		if (inits->malloc == NULL || inits->free == NULL) {
			ENET_LOG_ERROR("Memory allocator/free mechanism is NULL");
			return -1;
		}

		callbacks.malloc = inits->malloc;
		callbacks.free = inits->free;
	}

	if (inits->noMemory != NULL)
		callbacks.noMemory = inits->noMemory;

	return enet_initialize();
}